

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseTemplate
          (Parser *this,string *text,initializer_list<AssemblyTemplateArgument> variables)

{
  undefined8 *puVar1;
  long in_R8;
  long lVar2;
  AssemblyTemplateArgument *arg;
  string fullText;
  string sStack_48;
  
  puVar1 = (undefined8 *)variables._M_len;
  std::__cxx11::string::string((string *)&sStack_48,(string *)variables._M_array);
  *(undefined1 *)&text[4]._M_string_length = 1;
  *(undefined8 *)((long)&text[4]._M_string_length + 4) = Global.FileInfo._0_8_;
  for (lVar2 = in_R8 * 0x28; lVar2 != 0; lVar2 = lVar2 + -0x28) {
    replaceAll(&sStack_48,(char *)*puVar1,(string *)(puVar1 + 1));
    puVar1 = puVar1 + 5;
  }
  parseString(this,text);
  *(undefined1 *)&text[4]._M_string_length = 0;
  std::__cxx11::string::~string((string *)&sStack_48);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseTemplate(const std::string& text, std::initializer_list<AssemblyTemplateArgument> variables)
{
	std::string fullText = text;

	overrideFileInfo = true;
	overrideFileNum = Global.FileInfo.FileNum;
	overrideLineNum = Global.FileInfo.LineNumber;

	for (auto& arg: variables)
	{
		size_t count = replaceAll(fullText,arg.variableName,arg.value);
		(void)count;
#ifdef _DEBUG
		if (count != 0 && arg.value.empty())
			Logger::printError(Logger::Warning, "Empty replacement for %s",arg.variableName);
#endif
	}

	std::unique_ptr<CAssemblerCommand> result = parseString(fullText);
	overrideFileInfo = false;

	return result;
}